

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O3

void sg_setup(sg_desc *desc)

{
  uint32_t uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  wchar_t wVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar16;
  ulong uVar15;
  uint uVar17;
  uint uVar18;
  ulong local_118 [3];
  undefined4 uStack_100;
  undefined4 local_fc;
  undefined4 uStack_f8;
  void *pvStack_f4;
  wchar_t local_e4 [45];
  
  if (desc == (sg_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3d17,"void sg_setup(const sg_desc *)");
  }
  if ((desc->_start_canary != 0) || (desc->_end_canary != 0)) {
    __assert_fail("(desc->_start_canary == 0) && (desc->_end_canary == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3d18,"void sg_setup(const sg_desc *)");
  }
  if (((desc->allocator).alloc == (_func_void_ptr_size_t_void_ptr *)0x0) !=
      ((desc->allocator).free == (_func_void_void_ptr_void_ptr *)0x0)) {
    __assert_fail("(desc->allocator.alloc && desc->allocator.free) || (!desc->allocator.alloc && !desc->allocator.free)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3d19,"void sg_setup(const sg_desc *)");
  }
  memset(&_sg,0,0x658);
  uVar1 = desc->_start_canary;
  pvStack_f4 = (desc->logger).user_data;
  uStack_f8 = (undefined4)((ulong)(desc->logger).log_cb >> 0x20);
  local_118[2] = *(undefined8 *)((long)&(desc->allocator).free + 4);
  uVar2 = *(undefined8 *)((long)&(desc->allocator).user_data + 4);
  uStack_100 = (undefined4)uVar2;
  local_fc = (undefined4)((ulong)uVar2 >> 0x20);
  local_118[0] = *(ulong *)&desc->disable_validation;
  local_118[1] = *(undefined8 *)((long)&(desc->allocator).alloc + 4);
  wVar8 = (desc->context).sample_count;
  memcpy(local_e4,&(desc->context).gl,0xb4);
  _sg.desc.context.sample_count = wVar8 + (uint)(wVar8 == L'\0');
  uVar14 = -(uint)(desc->buffer_pool_size == L'\0');
  uVar16 = -(uint)(desc->image_pool_size == L'\0');
  uVar17 = -(uint)(desc->shader_pool_size == L'\0');
  uVar18 = -(uint)(desc->pipeline_pool_size == L'\0');
  wVar8 = uVar14 & 0x80 | ~uVar14 & desc->buffer_pool_size;
  _sg.desc.image_pool_size = uVar16 & 0x80 | ~uVar16 & desc->image_pool_size;
  _sg.desc.shader_pool_size = uVar17 & 0x20 | ~uVar17 & desc->shader_pool_size;
  _sg.desc.pipeline_pool_size = uVar18 & 0x40 | ~uVar18 & desc->pipeline_pool_size;
  uVar14 = -(uint)(desc->pass_pool_size == L'\0');
  uVar16 = -(uint)(desc->context_pool_size == L'\0');
  uVar17 = -(uint)(desc->uniform_buffer_size == L'\0');
  uVar18 = -(uint)(desc->staging_buffer_size == L'\0');
  _sg.desc.pass_pool_size = uVar14 & 0x10 | ~uVar14 & desc->pass_pool_size;
  _sg.desc.context_pool_size = uVar16 & 0x10 | ~uVar16 & desc->context_pool_size;
  _sg.desc.uniform_buffer_size = uVar17 & 0x400000 | ~uVar17 & desc->uniform_buffer_size;
  _sg.desc.staging_buffer_size = uVar18 & 0x800000 | ~uVar18 & desc->staging_buffer_size;
  uVar13._0_4_ = desc->sampler_cache_size;
  uVar13._4_4_ = desc->max_commit_listeners;
  uVar15 = CONCAT44(-(uint)(uVar13._4_4_ == 0),-(uint)((undefined4)uVar13 == 0));
  _sg.desc._36_8_ = uVar15 & (ulong)DAT_0019d090 | ~uVar15 & uVar13;
  uVar15._0_4_ = (desc->context).color_format;
  uVar15._4_4_ = (desc->context).depth_format;
  uVar13 = CONCAT44(-(uint)(uVar15._4_4_ == 0),-(uint)((undefined4)uVar15 == 0));
  _sg.desc.context._0_8_ = uVar13 & (ulong)DAT_0019d0a0 | ~uVar13 & uVar15;
  _sg.desc._44_8_ = local_118[0];
  _sg.desc.allocator._4_8_ = local_118[1];
  _sg.desc.allocator._12_8_ = local_118[2];
  _sg.desc.allocator.user_data._4_4_ = uStack_100;
  auVar3._4_4_ = uStack_f8;
  auVar3._0_4_ = local_fc;
  auVar3._8_8_ = pvStack_f4;
  _sg.desc.logger.log_cb._0_4_ = local_fc;
  _sg.desc.logger._4_12_ = auVar3._4_12_;
  _sg.desc._start_canary = uVar1;
  _sg.desc.buffer_pool_size = wVar8;
  memcpy(&_sg.desc.context.gl,local_e4,0xb4);
  if (0xffff < (uint)wVar8) {
    __assert_fail("(desc->buffer_pool_size > 0) && (desc->buffer_pool_size < _SG_MAX_POOL_SIZE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3711,"void _sg_setup_pools(_sg_pools_t *, const sg_desc *)");
  }
  _sg_init_pool(&_sg.pools.buffer_pool,wVar8);
  _sg.pools.buffers = (_sg_buffer_t *)_sg_malloc_clear((long)_sg.pools.buffer_pool.size * 0x3c);
  if (0xfffe < (uint)(_sg.desc.image_pool_size + L'\xffffffff')) {
    __assert_fail("(desc->image_pool_size > 0) && (desc->image_pool_size < _SG_MAX_POOL_SIZE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3716,"void _sg_setup_pools(_sg_pools_t *, const sg_desc *)");
  }
  _sg_init_pool(&_sg.pools.image_pool,_sg.desc.image_pool_size);
  _sg.pools.images = (_sg_image_t *)_sg_malloc_clear((long)_sg.pools.image_pool.size * 0x70);
  if (0xfffe < (uint)(_sg.desc.shader_pool_size + L'\xffffffff')) {
    __assert_fail("(desc->shader_pool_size > 0) && (desc->shader_pool_size < _SG_MAX_POOL_SIZE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x371b,"void _sg_setup_pools(_sg_pools_t *, const sg_desc *)");
  }
  _sg_init_pool(&_sg.pools.shader_pool,_sg.desc.shader_pool_size);
  _sg.pools.shaders = (_sg_shader_t *)_sg_malloc_clear((long)_sg.pools.shader_pool.size * 0x8a8);
  if (0xfffe < (uint)(_sg.desc.pipeline_pool_size + L'\xffffffff')) {
    __assert_fail("(desc->pipeline_pool_size > 0) && (desc->pipeline_pool_size < _SG_MAX_POOL_SIZE)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3720,"void _sg_setup_pools(_sg_pools_t *, const sg_desc *)");
  }
  _sg_init_pool(&_sg.pools.pipeline_pool,_sg.desc.pipeline_pool_size);
  _sg.pools.pipelines =
       (_sg_pipeline_t *)_sg_malloc_clear((long)_sg.pools.pipeline_pool.size * 0x1e0);
  if (0xfffe < (uint)(_sg.desc.pass_pool_size + L'\xffffffff')) {
    __assert_fail("(desc->pass_pool_size > 0) && (desc->pass_pool_size < _SG_MAX_POOL_SIZE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3725,"void _sg_setup_pools(_sg_pools_t *, const sg_desc *)");
  }
  _sg_init_pool(&_sg.pools.pass_pool,_sg.desc.pass_pool_size);
  _sg.pools.passes = (_sg_pass_t *)_sg_malloc_clear((long)_sg.pools.pass_pool.size * 0xa8);
  if (0xfffe < (uint)(_sg.desc.context_pool_size + L'\xffffffff')) {
    __assert_fail("(desc->context_pool_size > 0) && (desc->context_pool_size < _SG_MAX_POOL_SIZE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x372a,"void _sg_setup_pools(_sg_pools_t *, const sg_desc *)");
  }
  _sg_init_pool(&_sg.pools.context_pool,_sg.desc.context_pool_size);
  _sg.pools.contexts = (_sg_context_t *)_sg_malloc_clear((long)_sg.pools.context_pool.size * 0x14);
  if ((long)_sg.desc.max_commit_listeners < 1) {
    __assert_fail("desc->max_commit_listeners > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3cad,"void _sg_setup_commit_listeners(const sg_desc *)");
  }
  if (_sg.commit_listeners.items != (sg_commit_listener *)0x0) {
    __assert_fail("0 == _sg.commit_listeners.items",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3cae,"void _sg_setup_commit_listeners(const sg_desc *)");
  }
  if (_sg.commit_listeners.num != L'\0') {
    __assert_fail("0 == _sg.commit_listeners.num",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3caf,"void _sg_setup_commit_listeners(const sg_desc *)");
  }
  if (_sg.commit_listeners.upper != L'\0') {
    __assert_fail("0 == _sg.commit_listeners.upper",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3cb0,"void _sg_setup_commit_listeners(const sg_desc *)");
  }
  _sg.commit_listeners.num = _sg.desc.max_commit_listeners;
  _sg.commit_listeners.items =
       (sg_commit_listener *)_sg_malloc_clear((long)_sg.desc.max_commit_listeners << 4);
  _sg.frame_index = 1;
  _sg.gl.valid = true;
  _sg.gl.gles2 = false;
  do {
    iVar7 = glGetError();
  } while (iVar7 != 0);
  iVar7 = 0;
  _sg.backend = SG_BACKEND_GLCORE33;
  _sg.features.instancing = true;
  _sg.features.origin_top_left = false;
  _sg.features.multiple_render_targets = true;
  _sg.features.msaa_render_targets = true;
  _sg.features.imagetype_3d = true;
  _sg.features.imagetype_array = true;
  _sg.features.image_clamp_to_border = true;
  _sg.features.mrt_independent_blend_state = false;
  _sg.features.mrt_independent_write_mask = true;
  local_118[0] = local_118[0] & 0xffffffff00000000;
  glGetIntegerv(0x821d,local_118);
  if ((int)local_118[0] < 1) {
    bVar6 = false;
    bVar5 = false;
    bVar4 = false;
    bVar12 = false;
    bVar11 = false;
  }
  else {
    bVar11 = false;
    bVar12 = false;
    bVar4 = false;
    bVar5 = false;
    bVar6 = false;
    do {
      pcVar9 = (char *)glGetStringi(0x1f03,iVar7);
      if (pcVar9 != (char *)0x0) {
        pcVar10 = strstr(pcVar9,"_texture_compression_s3tc");
        if (pcVar10 == (char *)0x0) {
          pcVar10 = strstr(pcVar9,"_texture_compression_rgtc");
          if (pcVar10 == (char *)0x0) {
            pcVar10 = strstr(pcVar9,"_texture_compression_bptc");
            if (pcVar10 == (char *)0x0) {
              pcVar10 = strstr(pcVar9,"_texture_compression_pvrtc");
              if (pcVar10 == (char *)0x0) {
                pcVar10 = strstr(pcVar9,"_ES3_compatibility");
                if (pcVar10 == (char *)0x0) {
                  pcVar9 = strstr(pcVar9,"_texture_filter_anisotropic");
                  if (pcVar9 != (char *)0x0) {
                    _sg.gl.ext_anisotropic = true;
                  }
                }
                else {
                  bVar6 = true;
                }
              }
              else {
                bVar5 = true;
              }
            }
            else {
              bVar4 = true;
            }
          }
          else {
            bVar12 = true;
          }
        }
        else {
          bVar11 = true;
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < (int)local_118[0]);
  }
  iVar7 = glGetError();
  if (iVar7 != 0) {
    __assert_fail("glGetError() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x1809,"void _sg_gl_init_limits(void)");
  }
  glGetIntegerv(0xd33,local_e4);
  iVar7 = glGetError();
  if (iVar7 != 0) {
    __assert_fail("glGetError() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x180c,"void _sg_gl_init_limits(void)");
  }
  _sg.limits.max_image_size_2d = local_e4[0];
  _sg.limits.max_image_size_array = local_e4[0];
  glGetIntegerv(0x851c);
  iVar7 = glGetError();
  if (iVar7 != 0) {
    __assert_fail("glGetError() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x1810,"void _sg_gl_init_limits(void)");
  }
  _sg.limits.max_image_size_cube = local_e4[0];
  glGetIntegerv(0x8869);
  iVar7 = glGetError();
  if (iVar7 != 0) {
    __assert_fail("glGetError() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x1813,"void _sg_gl_init_limits(void)");
  }
  if (L'\x10' < local_e4[0]) {
    local_e4[0] = L'\x10';
  }
  _sg.limits.max_vertex_attrs = local_e4[0];
  glGetIntegerv(0x8dfb,local_e4);
  iVar7 = glGetError();
  if (iVar7 != 0) {
    __assert_fail("glGetError() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x1819,"void _sg_gl_init_limits(void)");
  }
  _sg.limits.gl_max_vertex_uniform_vectors = local_e4[0];
  if (_sg.gl.gles2 == false) {
    glGetIntegerv(0x8073,local_e4);
    iVar7 = glGetError();
    if (iVar7 != 0) {
      __assert_fail("glGetError() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                    ,0x181e,"void _sg_gl_init_limits(void)");
    }
    _sg.limits.max_image_size_3d = local_e4[0];
    glGetIntegerv(0x88ff);
    iVar7 = glGetError();
    if (iVar7 != 0) {
      __assert_fail("glGetError() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                    ,0x1821,"void _sg_gl_init_limits(void)");
    }
    _sg.limits.max_image_array_layers = local_e4[0];
  }
  wVar8 = L'\x01';
  if (_sg.gl.ext_anisotropic == true) {
    glGetIntegerv(0x84ff,local_e4);
    iVar7 = glGetError();
    wVar8 = local_e4[0];
    if (iVar7 != 0) {
      __assert_fail("glGetError() == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                    ,0x1827,"void _sg_gl_init_limits(void)");
    }
  }
  _sg.gl.max_anisotropy = wVar8;
  glGetIntegerv(0x8b4d,local_e4);
  iVar7 = glGetError();
  if (iVar7 != 0) {
    __assert_fail("glGetError() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x182e,"void _sg_gl_init_limits(void)");
  }
  _sg.gl.max_combined_texture_image_units = local_e4[0];
  if (_sg.gl.gles2 == true) {
    _sg.formats[2].sample = true;
    _sg.formats[2].filter = true;
  }
  else {
    _sg.formats[2].msaa = true;
    _sg.formats[2].sample = true;
    _sg.formats[2].filter = true;
    _sg.formats[2].render = true;
    _sg.formats[2].blend = true;
    _sg.formats[3].sample = true;
    _sg.formats[3].filter = true;
    _sg.formats[4].sample = true;
    _sg.formats[4].render = true;
    _sg.formats[4].msaa = true;
    _sg.formats[5].sample = true;
    _sg.formats[5].render = true;
    _sg.formats[5].msaa = true;
    _sg.formats[6].sample = true;
    _sg.formats[6].filter = true;
    _sg.formats[6].render = true;
    _sg.formats[6].blend = true;
    _sg.formats[6].msaa = true;
    _sg.formats[7].sample = true;
    _sg.formats[7].filter = true;
    _sg.formats[7].render = true;
    _sg.formats[7].blend = true;
    _sg.formats[7].msaa = true;
    _sg.formats[8].sample = true;
    _sg.formats[8].render = true;
    _sg.formats[8].msaa = true;
    _sg.formats[9].sample = true;
    _sg.formats[9].render = true;
    _sg.formats[9].msaa = true;
    _sg.formats[0xb].msaa = true;
    _sg.formats[0xb].sample = true;
    _sg.formats[0xb].filter = true;
    _sg.formats[0xb].render = true;
    _sg.formats[0xb].blend = true;
    _sg.formats[0xc].sample = true;
    _sg.formats[0xc].filter = true;
    _sg.formats[0xd].sample = true;
    _sg.formats[0xd].render = true;
    _sg.formats[0xd].msaa = true;
    _sg.formats[0xe].sample = true;
    _sg.formats[0xe].render = true;
    _sg.formats[0xe].msaa = true;
    _sg.formats[0xf].sample = true;
    _sg.formats[0xf].render = true;
    _sg.formats[0x10].sample = true;
    _sg.formats[0x10].render = true;
    _sg.formats[0x12].msaa = true;
    _sg.formats[0x12].sample = true;
    _sg.formats[0x12].filter = true;
    _sg.formats[0x12].render = true;
    _sg.formats[0x12].blend = true;
    _sg.formats[0x13].msaa = true;
    _sg.formats[0x13].sample = true;
    _sg.formats[0x13].filter = true;
    _sg.formats[0x13].render = true;
    _sg.formats[0x13].blend = true;
    _sg.formats[0x14].sample = true;
    _sg.formats[0x14].render = true;
    _sg.formats[0x14].msaa = true;
    _sg.formats[0x15].sample = true;
    _sg.formats[0x15].render = true;
    _sg.formats[0x15].msaa = true;
    _sg.formats[0x18].sample = true;
    _sg.formats[0x18].filter = true;
    _sg.formats[0x19].sample = true;
    _sg.formats[0x19].render = true;
    _sg.formats[0x19].msaa = true;
    _sg.formats[0x1a].sample = true;
    _sg.formats[0x1a].render = true;
    _sg.formats[0x1a].msaa = true;
    _sg.formats[0x1c].msaa = true;
    _sg.formats[0x1c].sample = true;
    _sg.formats[0x1c].filter = true;
    _sg.formats[0x1c].render = true;
    _sg.formats[0x1c].blend = true;
    _sg.formats[0x1d].sample = true;
    _sg.formats[0x1d].filter = true;
    _sg.formats[0x3e].sample = true;
    _sg.formats[0x3e].filter = true;
    _sg.formats[0x1e].sample = true;
    _sg.formats[0x1e].render = true;
    _sg.formats[0x1e].msaa = true;
    _sg.formats[0x1f].sample = true;
    _sg.formats[0x1f].render = true;
    _sg.formats[0x1f].msaa = true;
    _sg.formats[0x21].msaa = true;
    _sg.formats[0x21].sample = true;
    _sg.formats[0x21].filter = true;
    _sg.formats[0x21].render = true;
    _sg.formats[0x21].blend = true;
    _sg.formats[0x22].msaa = true;
    _sg.formats[0x22].sample = true;
    _sg.formats[0x22].filter = true;
    _sg.formats[0x22].render = true;
    _sg.formats[0x22].blend = true;
    _sg.formats[0x23].sample = true;
    _sg.formats[0x23].render = true;
    _sg.formats[0x23].msaa = true;
    _sg.formats[0x24].sample = true;
    _sg.formats[0x24].render = true;
    _sg.formats[0x24].msaa = true;
    _sg.formats[0x26].sample = true;
    _sg.formats[0x26].render = true;
    _sg.formats[0x26].msaa = true;
    _sg.formats[0x27].sample = true;
    _sg.formats[0x27].render = true;
    _sg.formats[0x27].msaa = true;
  }
  _sg.formats[0x17].msaa = true;
  _sg.formats[0x17].sample = true;
  _sg.formats[0x17].filter = true;
  _sg.formats[0x17].render = true;
  _sg.formats[0x17].blend = true;
  _sg.formats[0x29].sample = true;
  _sg.formats[0x29].render = true;
  _sg.formats[0x29].msaa = true;
  _sg.formats[0x29].depth = true;
  _sg.formats[0x2a].sample = true;
  _sg.formats[0x2a].render = true;
  _sg.formats[0x2a].msaa = true;
  _sg.formats[0x2a].depth = true;
  if (_sg.gl.gles2 == false) {
    _sg.formats[0x11].msaa = true;
    _sg.formats[0x11].sample = true;
    _sg.formats[0x11].filter = true;
    _sg.formats[0x11].render = true;
    _sg.formats[0x11].blend = true;
    _sg.formats[0x20].sample = true;
    _sg.formats[0x20].filter = true;
    _sg.formats[0x20].render = true;
    _sg.formats[0x20].blend = true;
    _sg.formats[0x20].msaa = true;
    _sg.formats[10].sample = true;
    _sg.formats[10].filter = true;
    _sg.formats[10].render = true;
    _sg.formats[10].blend = true;
    _sg.formats[10].msaa = true;
    _sg.formats[0x16].sample = true;
    _sg.formats[0x16].filter = true;
    _sg.formats[0x16].render = true;
    _sg.formats[0x16].blend = true;
    _sg.formats[0x16].msaa = true;
  }
  else {
    _sg.formats[0x11].sample = true;
    _sg.formats[0x11].filter = true;
    _sg.formats[10].sample = true;
    _sg.formats[10].filter = true;
  }
  _sg.formats[0x28].msaa = true;
  _sg.formats[0x28].sample = true;
  _sg.formats[0x28].filter = true;
  _sg.formats[0x28].render = true;
  _sg.formats[0x28].blend = true;
  _sg.formats[0x25].msaa = true;
  _sg.formats[0x25].sample = true;
  _sg.formats[0x25].filter = true;
  _sg.formats[0x25].render = true;
  _sg.formats[0x25].blend = true;
  if (bVar11) {
    _sg.formats[0x2b].sample = true;
    _sg.formats[0x2b].filter = true;
    _sg.formats[0x2c].sample = true;
    _sg.formats[0x2c].filter = true;
    _sg.formats[0x2d].sample = true;
    _sg.formats[0x2d].filter = true;
  }
  if (bVar12) {
    _sg.formats[0x2e].sample = true;
    _sg.formats[0x2e].filter = true;
    _sg.formats[0x2f].sample = true;
    _sg.formats[0x2f].filter = true;
    _sg.formats[0x30].sample = true;
    _sg.formats[0x30].filter = true;
    _sg.formats[0x31].sample = true;
    _sg.formats[0x31].filter = true;
  }
  if (bVar4) {
    _sg.formats[0x32].sample = true;
    _sg.formats[0x32].filter = true;
    _sg.formats[0x33].sample = true;
    _sg.formats[0x33].filter = true;
    _sg.formats[0x34].sample = true;
    _sg.formats[0x34].filter = true;
  }
  if (bVar5) {
    _sg.formats[0x35].sample = true;
    _sg.formats[0x35].filter = true;
    _sg.formats[0x36].sample = true;
    _sg.formats[0x36].filter = true;
    _sg.formats[0x37].sample = true;
    _sg.formats[0x37].filter = true;
    _sg.formats[0x38].sample = true;
    _sg.formats[0x38].filter = true;
  }
  if (bVar6) {
    _sg.formats[0x39].sample = true;
    _sg.formats[0x39].filter = true;
    _sg.formats[0x3a].sample = true;
    _sg.formats[0x3a].filter = true;
    _sg.formats[0x3b].sample = true;
    _sg.formats[0x3b].filter = true;
    _sg.formats[0x3c].sample = true;
    _sg.formats[0x3c].filter = true;
    _sg.formats[0x3d].sample = true;
    _sg.formats[0x3d].filter = true;
  }
  _sg.valid = true;
  sg_setup_context();
  return;
}

Assistant:

inline void sg_setup(const sg_desc& desc) { return sg_setup(&desc); }